

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void listFiles(string *dirName,
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *f)

{
  bool bVar1;
  path local_58;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_18;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *f_local;
  string *dirName_local;
  
  local_18 = f;
  f_local = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)dirName;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_58,dirName);
  bVar1 = std::experimental::filesystem::v1::is_directory(&local_58);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    _listFiles((string *)f_local,local_18);
  }
  else {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          f_local);
  }
  return;
}

Assistant:

void listFiles(const std::string& dirName,
               const std::function<void(const std::string& path)>& f)
{
    if (!fs::is_directory(dirName)) {
        f(dirName);
        return;
    }
    _listFiles(dirName, f);
}